

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O1

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>>
::
ForEachActive<mp::Convert1<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>,mp::Convert1QC>>
          (ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>>
           *this,Convert1<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_mp::Convert1QC>
                 fn)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  ConType *con;
  long lVar6;
  int i;
  long lVar7;
  Convert1<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_mp::Convert1QC>
  local_38;
  
  lVar6 = 0;
  lVar7 = 0;
  local_38.
  super_Convert1QC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  .
  super_MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  .mc_ = fn.
         super_Convert1QC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
         .
         super_MCKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
         .mc_;
  while( true ) {
    lVar4 = *(long *)(this + 0xf8);
    lVar1 = *(long *)(this + 0xe0);
    if ((int)((int)((ulong)(*(long *)(this + 0xf0) - lVar1) >> 4) * -0x45d1745d +
             (int)((ulong)(*(long *)(this + 0x100) - *(long *)(this + 0x108)) >> 4) * -0x45d1745d +
             ((int)((ulong)(*(long *)(this + 0x118) - lVar4) >> 3) + -1 +
             (uint)(*(long *)(this + 0x118) == 0)) * 2) <= lVar7) break;
    uVar3 = (lVar1 - *(long *)(this + 0xe8) >> 4) * 0x2e8ba2e8ba2e8ba3 + lVar7;
    if (uVar3 < 2) {
      lVar5 = lVar1 + lVar6;
    }
    else {
      lVar5 = (uVar3 + (uVar3 >> 1) * -2) * 0xb0 + *(long *)(lVar4 + (uVar3 >> 1) * 8);
    }
    if ((*(char *)(lVar5 + 0xa8) == '\0') && (*(char *)(lVar5 + 0xa9) == '\0')) {
      if (uVar3 < 2) {
        con = (ConType *)(lVar1 + lVar6);
      }
      else {
        con = (ConType *)((uVar3 + (uVar3 >> 1) * -2) * 0xb0 + *(long *)(lVar4 + (uVar3 >> 1) * 8));
      }
      bVar2 = Convert1<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>,_mp::Convert1QC>
              ::operator()(&local_38,con,(int)lVar7);
      if (bVar2) {
        lVar4 = (*(long *)(this + 0xe0) - *(long *)(this + 0xe8) >> 4) * 0x2e8ba2e8ba2e8ba3;
        uVar3 = lVar7 + lVar4;
        if (uVar3 < 2) {
          lVar4 = *(long *)(this + 0xe0) + lVar6;
        }
        else {
          uVar3 = uVar3 >> 1;
          lVar4 = (lVar4 + uVar3 * -2 + lVar7) * 0xb0 +
                  *(long *)(*(long *)(this + 0xf8) + uVar3 * 8);
        }
        if (*(char *)(lVar4 + 0xa8) == '\0') {
          *(undefined1 *)(lVar4 + 0xa8) = 1;
          *(int *)(this + 0x124) = *(int *)(this + 0x124) + 1;
        }
      }
    }
    lVar7 = lVar7 + 1;
    lVar6 = lVar6 + 0xb0;
  }
  return;
}

Assistant:

void ForEachActive(Fn fn) {
		for (int i=0; i<(int)cons_.size(); ++i)
      if (!cons_[i].IsRedundant())
        if (fn(cons_[i].GetCon(), i))
          MarkAsBridged(cons_[i], i);
	}